

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

lua_Unsigned luaH_getn(Table *t)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  TValue *pTVar4;
  uint boundary_1;
  uint boundary;
  uint limit;
  Table *t_local;
  
  boundary_1 = t->alimit;
  if ((boundary_1 != 0) && ((t->array[boundary_1 - 1].tt_ & 0xf) == 0)) {
    if ((1 < boundary_1) && ((t->array[boundary_1 - 2].tt_ & 0xf) != 0)) {
      iVar1 = ispow2realasize(t);
      if ((iVar1 != 0) && ((boundary_1 - 1 & boundary_1 - 2) != 0)) {
        t->alimit = boundary_1 - 1;
        t->flags = t->flags | 0x80;
      }
      return (ulong)(boundary_1 - 1);
    }
    uVar2 = binsearch(t->array,0,boundary_1);
    iVar1 = ispow2realasize(t);
    if ((iVar1 != 0) && (uVar3 = luaH_realasize(t), uVar3 >> 1 < uVar2)) {
      t->alimit = uVar2;
      t->flags = t->flags | 0x80;
    }
    return (ulong)uVar2;
  }
  if (((t->flags & 0x80) != 0) && ((t->alimit & t->alimit - 1) != 0)) {
    if ((t->array[boundary_1].tt_ & 0xf) == 0) {
      return (ulong)boundary_1;
    }
    boundary_1 = luaH_realasize(t);
    if ((t->array[boundary_1 - 1].tt_ & 0xf) == 0) {
      uVar2 = binsearch(t->array,t->alimit,boundary_1);
      t->alimit = uVar2;
      return (ulong)uVar2;
    }
  }
  if ((t->lastfree == (Node *)0x0) ||
     (pTVar4 = luaH_getint(t,(ulong)(boundary_1 + 1)), (pTVar4->tt_ & 0xf) == 0)) {
    t_local = (Table *)(ulong)boundary_1;
  }
  else {
    t_local = (Table *)hash_search(t,(ulong)boundary_1);
  }
  return (lua_Unsigned)t_local;
}

Assistant:

lua_Unsigned luaH_getn (Table *t) {
  unsigned int limit = t->alimit;
  if (limit > 0 && isempty(&t->array[limit - 1])) {  /* (1)? */
    /* there must be a boundary before 'limit' */
    if (limit >= 2 && !isempty(&t->array[limit - 2])) {
      /* 'limit - 1' is a boundary; can it be a new limit? */
      if (ispow2realasize(t) && !ispow2(limit - 1)) {
        t->alimit = limit - 1;
        setnorealasize(t);  /* now 'alimit' is not the real size */
      }
      return limit - 1;
    }
    else {  /* must search for a boundary in [0, limit] */
      unsigned int boundary = binsearch(t->array, 0, limit);
      /* can this boundary represent the real size of the array? */
      if (ispow2realasize(t) && boundary > luaH_realasize(t) / 2) {
        t->alimit = boundary;  /* use it as the new limit */
        setnorealasize(t);
      }
      return boundary;
    }
  }
  /* 'limit' is zero or present in table */
  if (!limitequalsasize(t)) {  /* (2)? */
    /* 'limit' > 0 and array has more elements after 'limit' */
    if (isempty(&t->array[limit]))  /* 'limit + 1' is empty? */
      return limit;  /* this is the boundary */
    /* else, try last element in the array */
    limit = luaH_realasize(t);
    if (isempty(&t->array[limit - 1])) {  /* empty? */
      /* there must be a boundary in the array after old limit,
         and it must be a valid new limit */
      unsigned int boundary = binsearch(t->array, t->alimit, limit);
      t->alimit = boundary;
      return boundary;
    }
    /* else, new limit is present in the table; check the hash part */
  }
  /* (3) 'limit' is the last element and either is zero or present in table */
  lua_assert(limit == luaH_realasize(t) &&
             (limit == 0 || !isempty(&t->array[limit - 1])));
  if (isdummy(t) || isempty(luaH_getint(t, cast(lua_Integer, limit + 1))))
    return limit;  /* 'limit + 1' is absent */
  else  /* 'limit + 1' is also present */
    return hash_search(t, limit);
}